

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_example_tweaks(options_i *options,vw *all)

{
  float *location;
  float *location_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  option_group_definition *poVar4;
  typed_option<unsigned_int> *op;
  typed_option<unsigned_long> *op_00;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op_01;
  typed_option<float> *op_02;
  namedlabels *pnVar5;
  ostream *poVar6;
  loss_function *plVar7;
  byte bVar8;
  float fVar9;
  float fVar10;
  bool test_only;
  allocator local_1068;
  allocator local_1067;
  allocator local_1066;
  allocator local_1065;
  allocator local_1064;
  allocator local_1063;
  allocator local_1062;
  allocator local_1061;
  allocator local_1060;
  allocator local_105f;
  allocator local_105e;
  allocator local_105d;
  allocator local_105c;
  allocator local_105b;
  allocator local_105a;
  allocator local_1059;
  allocator local_1058;
  allocator local_1057;
  allocator local_1056;
  allocator local_1055;
  allocator local_1054;
  allocator local_1053;
  allocator local_1052;
  allocator local_1051;
  allocator local_1050;
  allocator local_104f;
  allocator local_104e;
  allocator local_104d;
  allocator local_104c;
  allocator local_104b;
  allocator local_104a;
  allocator local_1049;
  allocator local_1048;
  allocator local_1047;
  allocator local_1046;
  allocator local_1045;
  float loss_parameter;
  size_t *local_1040;
  bool *local_1038;
  string loss_function;
  string named_labels;
  string local_ff0;
  string local_fd0;
  string local_fb0 [32];
  string local_f90;
  string local_f70 [32];
  string local_f50;
  string local_f30 [32];
  string local_f10;
  string local_ef0 [32];
  string local_ed0;
  string local_eb0 [32];
  string local_e90;
  string local_e70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  string local_e30;
  string local_e10 [32];
  string local_df0;
  string local_dd0 [32];
  string local_db0;
  string local_d90 [32];
  string local_d70;
  string local_d50 [32];
  string local_d30;
  string local_d10 [32];
  string local_cf0;
  string local_cd0 [32];
  string local_cb0;
  string local_c90 [32];
  string local_c70;
  string local_c50 [32];
  string local_c30;
  string local_c10 [32];
  string local_bf0;
  string local_bd0 [32];
  string local_bb0;
  string local_b90 [32];
  string local_b70 [32];
  string local_b50;
  undefined1 local_b30 [80];
  string local_ae0 [80];
  string local_a90;
  size_t early_terminate_passes;
  option_group_definition example_options;
  undefined1 local_a30 [160];
  undefined1 local_990 [112];
  bool local_920;
  undefined1 local_8f0 [160];
  undefined1 local_850 [160];
  undefined1 local_7b0 [160];
  undefined1 local_710 [160];
  undefined1 local_670 [160];
  undefined1 local_5d0 [160];
  undefined1 local_530 [160];
  undefined1 local_490 [160];
  undefined1 local_3f0 [160];
  undefined1 local_350 [160];
  typed_option<unsigned_int> local_2b0;
  typed_option<float> local_210;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<unsigned_long> local_d0;
  
  named_labels._M_dataplus._M_p = (pointer)&named_labels.field_2;
  named_labels._M_string_length = 0;
  named_labels.field_2._M_local_buf[0] = '\0';
  loss_function._M_dataplus._M_p = (pointer)&loss_function.field_2;
  loss_function._M_string_length = 0;
  loss_function.field_2._M_local_buf[0] = '\0';
  loss_parameter = 0.0;
  test_only = false;
  std::__cxx11::string::string((string *)&local_a90,"Example options",(allocator *)local_b30);
  VW::config::option_group_definition::option_group_definition(&example_options,&local_a90);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::string((string *)&local_b50,"testonly",&local_1045);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_b30,&local_b50,&test_only);
  std::__cxx11::string::string(local_b70,"t",&local_1046);
  std::__cxx11::string::_M_assign(local_ae0);
  std::__cxx11::string::string(local_b90,"Ignore label information and just test",&local_1047);
  std::__cxx11::string::_M_assign((string *)(local_b30 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&example_options,(typed_option<bool> *)local_b30);
  std::__cxx11::string::string((string *)&local_bb0,"holdout_off",&local_1048);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_a30,&local_bb0,&all->holdout_set_off);
  std::__cxx11::string::string(local_bd0,"no holdout data in multiple passes",&local_1049);
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_a30);
  std::__cxx11::string::string((string *)&local_bf0,"holdout_period",&local_104a);
  VW::config::typed_option<unsigned_int>::typed_option(&local_2b0,&local_bf0,&all->holdout_period);
  op = VW::config::typed_option<unsigned_int>::default_value(&local_2b0,10);
  std::__cxx11::string::string(local_c10,"holdout period for test only",&local_104b);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar4,op);
  std::__cxx11::string::string((string *)&local_c30,"holdout_after",&local_104c);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_8f0,&local_c30,&all->holdout_after);
  std::__cxx11::string::string
            (local_c50,"holdout after n training examples, default off (disables holdout_period)",
             &local_104d);
  std::__cxx11::string::_M_assign((string *)(local_8f0 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                     (poVar4,(typed_option<unsigned_int> *)local_8f0);
  std::__cxx11::string::string((string *)&local_c70,"early_terminate",&local_104e);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,&local_c70,&early_terminate_passes);
  op_00 = VW::config::typed_option<unsigned_long>::default_value(&local_d0,3);
  std::__cxx11::string::string
            (local_c90,
             "Specify the number of passes tolerated when holdout loss doesn\'t decrease before early termination"
             ,&local_104f);
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,op_00);
  local_1038 = &all->holdout_set_off;
  std::__cxx11::string::string((string *)&local_cb0,"passes",&local_1050);
  local_1040 = &all->numpasses;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_350,&local_cb0,local_1040);
  std::__cxx11::string::string(local_cd0,"Number of Training Passes",&local_1051);
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,(typed_option<unsigned_long> *)local_350);
  std::__cxx11::string::string((string *)&local_cf0,"initial_pass_length",&local_1052);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_3f0,&local_cf0,&all->pass_length);
  std::__cxx11::string::string(local_d10,"initial number of examples per pass",&local_1053);
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,(typed_option<unsigned_long> *)local_3f0);
  std::__cxx11::string::string((string *)&local_d30,"examples",&local_1054);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_490,&local_d30,&all->max_examples);
  std::__cxx11::string::string(local_d50,"number of examples to parse",&local_1055);
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar4,(typed_option<unsigned_long> *)local_490);
  std::__cxx11::string::string((string *)&local_d70,"min_prediction",&local_1056);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_530,&local_d70,&all->sd->min_label);
  std::__cxx11::string::string(local_d90,"Smallest prediction to output",&local_1057);
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar4,(typed_option<float> *)local_530);
  std::__cxx11::string::string((string *)&local_db0,"max_prediction",&local_1058);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_5d0,&local_db0,&all->sd->max_label);
  std::__cxx11::string::string(local_dd0,"Largest prediction to output",&local_1059);
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar4,(typed_option<float> *)local_5d0);
  std::__cxx11::string::string((string *)&local_df0,"sort_features",&local_105a);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_670,&local_df0,&all->p->sort_features);
  std::__cxx11::string::string
            (local_e10,
             "turn this on to disregard order in which features have been defined. This will lead to smaller cache sizes"
             ,&local_105b);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_670);
  std::__cxx11::string::string((string *)&local_e30,"loss_function",&local_105c);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,&local_e30,&loss_function);
  std::__cxx11::string::string((string *)&local_e50,"squared",&local_105d);
  op_01 = VW::config::
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::default_value(&local_170,&local_e50);
  std::__cxx11::string::string
            (local_e70,
             "Specify the loss function to be used, uses squared by default. Currently available ones are squared, classic, hinge, logistic, quantile and poisson."
             ,&local_105e);
  std::__cxx11::string::_M_assign((string *)&(op_01->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar4,op_01);
  std::__cxx11::string::string((string *)&local_e90,"quantile_tau",&local_105f);
  VW::config::typed_option<float>::typed_option(&local_210,&local_e90,&loss_parameter);
  op_02 = VW::config::typed_option<float>::default_value(&local_210,0.5);
  std::__cxx11::string::string
            (local_eb0,"Parameter \\tau associated with Quantile loss. Defaults to 0.5",&local_1060)
  ;
  std::__cxx11::string::_M_assign((string *)&(op_02->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,op_02);
  std::__cxx11::string::string((string *)&local_ed0,"l1",&local_1061);
  location = &all->l1_lambda;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_710,&local_ed0,location);
  std::__cxx11::string::string(local_ef0,"l_1 lambda",&local_1062);
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar4,(typed_option<float> *)local_710);
  std::__cxx11::string::string((string *)&local_f10,"l2",&local_1063);
  location_00 = &all->l2_lambda;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_7b0,&local_f10,location_00);
  std::__cxx11::string::string(local_f30,"l_2 lambda",&local_1064);
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar4,(typed_option<float> *)local_7b0);
  std::__cxx11::string::string((string *)&local_f50,"no_bias_regularization",&local_1065);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_850,&local_f50,&all->no_bias);
  std::__cxx11::string::string(local_f70,"no bias in regularization",&local_1066);
  std::__cxx11::string::_M_assign((string *)(local_850 + 0x30));
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar4,(typed_option<bool> *)local_850);
  std::__cxx11::string::string((string *)&local_f90,"named_labels",&local_1067);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_990,&local_f90,&named_labels);
  local_920 = true;
  std::__cxx11::string::string
            (local_fb0,
             "use names for labels (multiclass, etc.) rather than integers, argument specified all possible labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""
             ,&local_1068);
  std::__cxx11::string::_M_assign((string *)(local_990 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar4,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_990);
  std::__cxx11::string::~string(local_fb0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_990);
  std::__cxx11::string::~string((string *)&local_f90);
  std::__cxx11::string::~string(local_f70);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_850);
  std::__cxx11::string::~string((string *)&local_f50);
  std::__cxx11::string::~string(local_f30);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_7b0);
  std::__cxx11::string::~string((string *)&local_f10);
  std::__cxx11::string::~string(local_ef0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_710);
  std::__cxx11::string::~string((string *)&local_ed0);
  std::__cxx11::string::~string(local_eb0);
  VW::config::typed_option<float>::~typed_option(&local_210);
  std::__cxx11::string::~string((string *)&local_e90);
  std::__cxx11::string::~string(local_e70);
  std::__cxx11::string::~string((string *)&local_e50);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_170);
  std::__cxx11::string::~string((string *)&local_e30);
  std::__cxx11::string::~string(local_e10);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_670);
  std::__cxx11::string::~string((string *)&local_df0);
  std::__cxx11::string::~string(local_dd0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_5d0);
  std::__cxx11::string::~string((string *)&local_db0);
  std::__cxx11::string::~string(local_d90);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_530);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string(local_d50);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_490);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string(local_d10);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_3f0);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string(local_cd0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_350);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::__cxx11::string::~string(local_c90);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_d0);
  std::__cxx11::string::~string((string *)&local_c70);
  std::__cxx11::string::~string(local_c50);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_8f0);
  std::__cxx11::string::~string((string *)&local_c30);
  std::__cxx11::string::~string(local_c10);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_2b0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::__cxx11::string::~string(local_bd0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_a30);
  std::__cxx11::string::~string((string *)&local_bb0);
  std::__cxx11::string::~string(local_b90);
  std::__cxx11::string::~string(local_b70);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_b30);
  std::__cxx11::string::~string((string *)&local_b50);
  (**options->_vptr_options_i)(options,&example_options);
  if ((test_only == false) && ((all->eta != 0.0 || (NAN(all->eta))))) {
    all->training = true;
  }
  else {
    if (all->quiet == false) {
      poVar6 = std::operator<<(&(all->trace_message).super_ostream,"only testing");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    all->training = false;
    if (all->lda != 0) {
      all->eta = 0.0;
    }
  }
  if (((*local_1040 < 2) && (all->holdout_after == 0)) || (*local_1038 == true)) {
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  *local_1038 = bVar1;
  std::__cxx11::string::string((string *)local_b30,"min_prediction",(allocator *)&local_2b0);
  iVar2 = (*options->_vptr_options_i[1])(options,local_b30);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_a30,"max_prediction",(allocator *)local_8f0);
    iVar2 = (*options->_vptr_options_i[1])(options,local_a30);
    bVar8 = (byte)iVar2 | test_only;
    std::__cxx11::string::~string((string *)local_a30);
    std::__cxx11::string::~string((string *)local_b30);
    if ((bVar8 & 1) == 0) goto LAB_001213fd;
  }
  else {
    std::__cxx11::string::~string((string *)local_b30);
  }
  all->set_minmax = noop_mm;
LAB_001213fd:
  std::__cxx11::string::string((string *)local_b30,"named_labels",(allocator *)local_a30);
  iVar2 = (*options->_vptr_options_i[1])(options,local_b30);
  std::__cxx11::string::~string((string *)local_b30);
  if ((char)iVar2 != '\0') {
    pnVar5 = calloc_or_throw<namedlabels>();
    all->sd->ldict = pnVar5;
    pnVar5 = all->sd->ldict;
    std::__cxx11::string::string((string *)&local_fd0,(string *)&named_labels);
    namedlabels::namedlabels(pnVar5,&local_fd0);
    std::__cxx11::string::~string((string *)&local_fd0);
    if (all->quiet == false) {
      poVar6 = std::operator<<(&(all->trace_message).super_ostream,"parsed ");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6," named labels");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  std::__cxx11::string::string((string *)&local_ff0,(string *)&loss_function);
  plVar7 = getLossFunction(all,&local_ff0,loss_parameter);
  all->loss = plVar7;
  std::__cxx11::string::~string((string *)&local_ff0);
  fVar9 = all->l1_lambda;
  if (fVar9 < 0.0) {
    poVar6 = std::operator<<(&(all->trace_message).super_ostream,
                             "l1_lambda should be nonnegative: resetting from ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*location);
    poVar6 = std::operator<<(poVar6," to 0");
    std::endl<char,std::char_traits<char>>(poVar6);
    *location = 0.0;
    fVar9 = 0.0;
  }
  fVar10 = *location_00;
  if (fVar10 < 0.0) {
    poVar6 = std::operator<<(&(all->trace_message).super_ostream,
                             "l2_lambda should be nonnegative: resetting from ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*location_00);
    poVar6 = std::operator<<(poVar6," to 0");
    std::endl<char,std::char_traits<char>>(poVar6);
    *location_00 = 0.0;
    fVar9 = *location;
    fVar10 = 0.0;
  }
  uVar3 = (uint)(0.0 < fVar9) + all->reg_mode;
  all->reg_mode = uVar3 + (uint)(0.0 < fVar10) * 2;
  if (all->quiet == false) {
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::string((string *)local_b30,"bfgs",(allocator *)local_a30);
      iVar2 = (*options->_vptr_options_i[1])(options,local_b30);
      std::__cxx11::string::~string((string *)local_b30);
      if ((char)iVar2 == '\0') {
        poVar6 = std::operator<<(&(all->trace_message).super_ostream,"using l1 regularization = ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,*location);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
    if (1 < all->reg_mode) {
      poVar6 = std::operator<<(&(all->trace_message).super_ostream,"using l2 regularization = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*location_00);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
  }
  VW::config::option_group_definition::~option_group_definition(&example_options);
  std::__cxx11::string::~string((string *)&loss_function);
  std::__cxx11::string::~string((string *)&named_labels);
  return;
}

Assistant:

void parse_example_tweaks(options_i& options, vw& all)
{
  string named_labels;
  string loss_function;
  float loss_parameter = 0.0;
  size_t early_terminate_passes;
  bool test_only = false;

  option_group_definition example_options("Example options");
  example_options.add(make_option("testonly", test_only).short_name("t").help("Ignore label information and just test"))
      .add(make_option("holdout_off", all.holdout_set_off).help("no holdout data in multiple passes"))
      .add(make_option("holdout_period", all.holdout_period).default_value(10).help("holdout period for test only"))
      .add(make_option("holdout_after", all.holdout_after)
               .help("holdout after n training examples, default off (disables holdout_period)"))
      .add(
          make_option("early_terminate", early_terminate_passes)
              .default_value(3)
              .help(
                  "Specify the number of passes tolerated when holdout loss doesn't decrease before early termination"))
      .add(make_option("passes", all.numpasses).help("Number of Training Passes"))
      .add(make_option("initial_pass_length", all.pass_length).help("initial number of examples per pass"))
      .add(make_option("examples", all.max_examples).help("number of examples to parse"))
      .add(make_option("min_prediction", all.sd->min_label).help("Smallest prediction to output"))
      .add(make_option("max_prediction", all.sd->max_label).help("Largest prediction to output"))
      .add(make_option("sort_features", all.p->sort_features)
               .help("turn this on to disregard order in which features have been defined. This will lead to smaller "
                     "cache sizes"))
      .add(make_option("loss_function", loss_function)
               .default_value("squared")
               .help("Specify the loss function to be used, uses squared by default. Currently available ones are "
                     "squared, classic, hinge, logistic, quantile and poisson."))
      .add(make_option("quantile_tau", loss_parameter)
               .default_value(0.5f)
               .help("Parameter \\tau associated with Quantile loss. Defaults to 0.5"))
      .add(make_option("l1", all.l1_lambda).help("l_1 lambda"))
      .add(make_option("l2", all.l2_lambda).help("l_2 lambda"))
      .add(make_option("no_bias_regularization", all.no_bias).help("no bias in regularization"))
      .add(make_option("named_labels", named_labels)
               .keep()
               .help("use names for labels (multiclass, etc.) rather than integers, argument specified all possible "
                     "labels, comma-sep, eg \"--named_labels Noun,Verb,Adj,Punc\""));
  options.add_and_parse(example_options);

  if (test_only || all.eta == 0.)
  {
    if (!all.quiet)
      all.trace_message << "only testing" << endl;
    all.training = false;
    if (all.lda > 0)
      all.eta = 0;
  }
  else
    all.training = true;

  if ((all.numpasses > 1 || all.holdout_after > 0) && !all.holdout_set_off)
    all.holdout_set_off = false;  // holdout is on unless explicitly off
  else
    all.holdout_set_off = true;

  if (options.was_supplied("min_prediction") || options.was_supplied("max_prediction") || test_only)
    all.set_minmax = noop_mm;

  if (options.was_supplied("named_labels"))
  {
    all.sd->ldict = &calloc_or_throw<namedlabels>();
    new (all.sd->ldict) namedlabels(named_labels);
    if (!all.quiet)
      all.trace_message << "parsed " << all.sd->ldict->getK() << " named labels" << endl;
  }

  all.loss = getLossFunction(all, loss_function, loss_parameter);

  if (all.l1_lambda < 0.)
  {
    all.trace_message << "l1_lambda should be nonnegative: resetting from " << all.l1_lambda << " to 0" << endl;
    all.l1_lambda = 0.;
  }
  if (all.l2_lambda < 0.)
  {
    all.trace_message << "l2_lambda should be nonnegative: resetting from " << all.l2_lambda << " to 0" << endl;
    all.l2_lambda = 0.;
  }
  all.reg_mode += (all.l1_lambda > 0.) ? 1 : 0;
  all.reg_mode += (all.l2_lambda > 0.) ? 2 : 0;
  if (!all.quiet)
  {
    if (all.reg_mode % 2 && !options.was_supplied("bfgs"))
      all.trace_message << "using l1 regularization = " << all.l1_lambda << endl;
    if (all.reg_mode > 1)
      all.trace_message << "using l2 regularization = " << all.l2_lambda << endl;
  }
}